

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O3

int nsdiffs(double *x,int N,int f,double *alpha,char *test,int *max_D)

{
  uint uVar1;
  int iVar2;
  double *sig;
  double *oup;
  char *__s;
  uint uVar3;
  size_t __size;
  uint local_44;
  double local_40;
  
  if (alpha == (double *)0x0) {
    local_40 = 0.05;
  }
  else {
    local_40 = *alpha;
  }
  if (max_D == (int *)0x0) {
    local_44 = 1;
  }
  else {
    local_44 = *max_D;
    if ((int)local_44 < 0) {
      puts("Error. Maximum Difference cannot be less than 0 ");
      exit(-1);
    }
  }
  if (0.01 <= local_40) {
    if (local_40 <= 0.1) goto LAB_001339fa;
    local_40 = 0.1;
    __s = "Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. ";
  }
  else {
    local_40 = 0.01;
    __s = "Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. ";
  }
  puts(__s);
LAB_001339fa:
  iVar2 = strcmp(test,"ocsb");
  if (((local_40 != 0.05) || (NAN(local_40))) && (iVar2 == 0)) {
    printf(
          "Significance levels other than 5%% are not currently supported by test=\'ocsb\', defaulting to alpha = 0.05."
          );
  }
  iVar2 = checkConstant(x,N);
  uVar3 = 0;
  if (iVar2 != 1) {
    if (f < 2) {
      puts("Warning : Only data with f > 1 can be differenced. ");
    }
    else {
      iVar2 = runseasonalitytests(x,N,f,test);
      __size = (long)N << 3;
      sig = (double *)malloc(__size);
      oup = (double *)malloc(__size);
      memcpy(sig,x,__size);
      uVar3 = 0;
      if (local_44 != 0 && iVar2 == 1) {
        uVar1 = 1;
        while( true ) {
          uVar3 = uVar1;
          N = diffs(sig,N,1,f,oup);
          iVar2 = checkConstant(oup,N);
          if (iVar2 == 1) break;
          iVar2 = runseasonalitytests(oup,N,f,test);
          memcpy(sig,oup,(long)N << 3);
          if ((iVar2 != 1) || (uVar1 = uVar3 + 1, local_44 <= uVar3)) break;
        }
      }
      free(sig);
      free(oup);
    }
  }
  return uVar3;
}

Assistant:

int nsdiffs(double *x, int N,int f,double *alpha, const char *test, int *max_D)  {
    int D,max_D_,cc,NX,dodiff;
    double alpha_;
    double *y,*z;

    D = 0;

    alpha_ = alpha == NULL ? 0.05 : *alpha;
    max_D_ = max_D == NULL ? 1 : *max_D;

    if (max_D_ < 0) {
        printf("Error. Maximum Difference cannot be less than 0 \n");
        exit(-1);
    } 

    if (alpha_ < 0.01) {
        alpha_ = 0.01;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. \n");
    }

    if (alpha_ > 0.1) {
        alpha_ = 0.1;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. \n");
    }

    if (!strcmp(test,"ocsb")) {
        if (alpha_ != 0.05) {
            printf("Significance levels other than 5%% are not currently supported by test='ocsb', defaulting to alpha = 0.05.");
            alpha_ = 0.05;
        }
    }

    cc = checkConstant(x,N);
    //printf("cc %d \n",cc);

    if (cc == 1) return D;

    NX = N;

    if (f <= 1) {
        printf("Warning : Only data with f > 1 can be differenced. \n");
        return 0;
    }

    dodiff = runseasonalitytests(x,N,f,test);

    y = (double*)malloc(sizeof(double)*NX);
    z = (double*)malloc(sizeof(double)*NX);

    memcpy(y,x,sizeof(double)*NX);

    while (dodiff == 1 && D < max_D_) {
        D++;
        NX = diffs(y,NX,1,f,z);

        cc = checkConstant(z,NX);

        //printf("cc %d \n",cc);

        if (cc == 1) break;

        dodiff = runseasonalitytests(z,NX,f,test);
        memcpy(y,z,sizeof(double)*NX);
    }

    free(y);
    free(z);

    return D;
}